

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlerror(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xmlerror : 6 of 17 functions ...\n");
  }
  iVar1 = test_xmlCopyError();
  iVar2 = test_xmlCtxtGetLastError();
  iVar3 = test_xmlCtxtResetLastError();
  iVar4 = test_xmlFormatError();
  iVar5 = test_xmlGetLastError();
  iVar6 = test_xmlParserError();
  iVar7 = test_xmlParserPrintFileContext();
  iVar8 = test_xmlParserPrintFileInfo();
  iVar9 = test_xmlParserValidityError();
  iVar10 = test_xmlParserValidityWarning();
  iVar11 = test_xmlParserWarning();
  iVar12 = test_xmlResetError();
  iVar13 = test_xmlResetLastError();
  iVar14 = test_xmlSetGenericErrorFunc();
  iVar15 = test_xmlSetStructuredErrorFunc();
  iVar16 = test_xmlThrDefSetGenericErrorFunc();
  iVar17 = test_xmlThrDefSetStructuredErrorFunc();
  uVar18 = iVar17 + iVar16 + iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + 
                                                  iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + 
                                                  iVar1;
  if (uVar18 != 0) {
    printf("Module xmlerror: %d errors\n",(ulong)uVar18);
  }
  return uVar18;
}

Assistant:

static int
test_xmlerror(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlerror : 6 of 17 functions ...\n");
    test_ret += test_xmlCopyError();
    test_ret += test_xmlCtxtGetLastError();
    test_ret += test_xmlCtxtResetLastError();
    test_ret += test_xmlFormatError();
    test_ret += test_xmlGetLastError();
    test_ret += test_xmlParserError();
    test_ret += test_xmlParserPrintFileContext();
    test_ret += test_xmlParserPrintFileInfo();
    test_ret += test_xmlParserValidityError();
    test_ret += test_xmlParserValidityWarning();
    test_ret += test_xmlParserWarning();
    test_ret += test_xmlResetError();
    test_ret += test_xmlResetLastError();
    test_ret += test_xmlSetGenericErrorFunc();
    test_ret += test_xmlSetStructuredErrorFunc();
    test_ret += test_xmlThrDefSetGenericErrorFunc();
    test_ret += test_xmlThrDefSetStructuredErrorFunc();

    if (test_ret != 0)
	printf("Module xmlerror: %d errors\n", test_ret);
    return(test_ret);
}